

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O3

void mainLoop(void)

{
  Console *this;
  
  this = Console::Instance();
  if (isRunning == '\x01') {
    do {
      Console::frame(this);
    } while (isRunning != '\0');
  }
  return;
}

Assistant:

void mainLoop() {
    Console &c = Console::Instance();

#ifdef __EMSCRIPTEN__
    c.getCPU()->execute();
    c.getCPU()->execute();
#endif

    while (isRunning) {
	    c.frame();
    }
}